

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

void QtPrivate::QStringList_replaceInStrings
               (QStringList *that,QStringView before,QStringView after,CaseSensitivity cs)

{
  bool bVar1;
  pointer pQVar2;
  long lVar3;
  qsizetype j;
  ulong uVar4;
  
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    if ((ulong)(that->d).size <= uVar4) {
      return;
    }
    bVar1 = QString::contains((QString *)((long)&(((that->d).ptr)->d).d + lVar3),before,cs);
    if (bVar1) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  for (; uVar4 < (ulong)(that->d).size; uVar4 = uVar4 + 1) {
    pQVar2 = QList<QString>::data(that);
    QString::replace((QString *)((long)&(pQVar2->d).d + lVar3),(QChar *)before.m_data,before.m_size,
                     (QChar *)after.m_data,after.m_size,cs);
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void QtPrivate::QStringList_replaceInStrings(QStringList *that, QStringView before,
                                             QStringView after, Qt::CaseSensitivity cs)
{
    // Before potentially detaching "that" list, check if any string contains "before"
    qsizetype i = -1;
    for (qsizetype j = 0; j < that->size(); ++j) {
        if (that->at(j).contains(before, cs)) {
            i = j;
            break;
        }
    }
    if (i == -1)
        return;

    for (; i < that->size(); ++i)
        (*that)[i].replace(before.data(), before.size(), after.data(), after.size(), cs);
}